

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini_processing.cpp
# Opt level: O0

void __thiscall IniProcessing::setValue(IniProcessing *this,char *key,char *value)

{
  allocator local_41;
  string local_40;
  char *local_20;
  char *value_local;
  char *key_local;
  IniProcessing *this_local;
  
  local_20 = value;
  value_local = key;
  key_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,value,&local_41);
  writeIniParam(this,key,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

void IniProcessing::setValue(const char *key, const char *value)
{
    writeIniParam(key, value);
}